

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.cpp
# Opt level: O2

void __thiscall Rml::Property::Property(Property *this)

{
  Variant::Variant(&this->value);
  this->unit = UNKNOWN;
  this->specificity = -1;
  (this->source).super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->source).super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->definition = (PropertyDefinition *)0x0;
  this->parser_index = -1;
  return;
}

Assistant:

Property::Property() : unit(Unit::UNKNOWN), specificity(-1)
{
	definition = nullptr;
	parser_index = -1;
}